

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

QSQLiteDriverPrivate * __thiscall
QSQLiteDriverPrivate::getTableInfo
          (QSQLiteDriverPrivate *this,QSqlQuery *query,QString *tableName,bool onlyPIndex)

{
  char16_t cVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  qsizetype qVar6;
  QString *pQVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined7 in_register_00000009;
  RequiredStatus RVar12;
  int iVar13;
  byte in_R8B;
  QChar *pQVar14;
  long lVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QStringView QVar17;
  QStringView QVar18;
  QLatin1String QVar19;
  QSqlIndex *ind;
  QSqlField fld;
  QMetaType local_138;
  QString local_130;
  QString local_118;
  QString local_f8;
  QString local_d8;
  QString local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QString_&>,_char16_t>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(**(long **)(query + 8) + 0xa0))
            (&local_d8,*(long **)(query + 8),(QString *)CONCAT71(in_register_00000009,onlyPIndex),1)
  ;
  local_78.a.a.a.a.m_size = local_d8.d.size;
  local_78.a.a.a.a.m_data = (char *)local_d8.d.ptr;
  uVar11 = QStringView::indexOf((QStringView *)&local_78,(QChar)0x2e,0,CaseSensitive);
  if (((long)uVar11 < 0) || (uVar11 < 3)) goto LAB_00111da9;
  lVar15 = local_d8.d.size - (uVar11 + 1);
  cVar1 = *local_d8.d.ptr;
  if (cVar1 == L'`') {
    bVar16 = ((QChar *)(local_d8.d.ptr + (uVar11 - 1)))->ucs == L'`';
LAB_00111bf9:
    if (!(bool)(bVar16 & 2 < lVar15)) goto LAB_00111da9;
  }
  else {
    if (cVar1 != L'[') {
      if (cVar1 != L'\"') goto LAB_00111da9;
      bVar16 = ((QChar *)(local_d8.d.ptr + (uVar11 - 1)))->ucs == L'\"';
      goto LAB_00111bf9;
    }
    if (lVar15 < 3 || ((QChar *)(local_d8.d.ptr + (uVar11 - 1)))->ucs != L']') goto LAB_00111da9;
  }
  pQVar14 = (QChar *)(local_d8.d.ptr + uVar11 + 1);
  cVar1 = pQVar14->ucs;
  if (cVar1 == L'`') {
    if (((QChar *)
        (local_d8.d.ptr + (long)((long)&(((QString *)(local_d8.d.size + -0x18))->d).size + 7)))->ucs
        != L'`') goto LAB_00111da9;
  }
  else if (cVar1 == L'[') {
    if (((QChar *)
        (local_d8.d.ptr + (long)((long)&(((QString *)(local_d8.d.size + -0x18))->d).size + 7)))->ucs
        != L']') goto LAB_00111da9;
  }
  else if ((cVar1 != L'\"') ||
          (((QChar *)
           (local_d8.d.ptr + (long)((long)&(((QString *)(local_d8.d.size + -0x18))->d).size + 7)))->
           ucs != L'\"')) goto LAB_00111da9;
  QString::QString(&local_f8,(QChar *)local_d8.d.ptr,uVar11);
  local_78.a.a.a.b = (QString *)local_f8.d.size;
  local_78.a.a.a.a.m_data = (char *)local_f8.d.ptr;
  local_78.a.a.a.a.m_size = (qsizetype)local_f8.d.d;
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (char16_t *)0x0;
  local_f8.d.size = 0;
  local_78.a.a.b.m_size = CONCAT62(local_78.a.a.b.m_size._2_6_,0x2e);
  QStringBuilder<QString,_char16_t>::convertTo<QString>
            ((QString *)&local_98,(QStringBuilder<QString,_char16_t> *)&local_78);
  uVar5 = local_98._16_8_;
  uVar4 = local_98.shared;
  pcVar3 = local_b8.d.ptr;
  pDVar2 = local_b8.d.d;
  local_98.shared = (PrivateShared *)local_b8.d.d;
  local_b8.d.d = (Data *)uVar4;
  local_b8.d.ptr = (char16_t *)local_98._8_8_;
  local_98._8_8_ = pcVar3;
  local_98._16_8_ = local_b8.d.size;
  local_b8.d.size = uVar5;
  if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78.a.a.a.a.m_size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78.a.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78.a.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78.a.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_78.a.a.a.a.m_size,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QString::QString((QString *)&local_78,pQVar14,lVar15);
  pQVar7 = local_78.a.a.a.b;
  qVar6 = local_78.a.a.a.a.m_size;
  pcVar3 = local_d8.d.ptr;
  pDVar2 = local_d8.d.d;
  local_78.a.a.a.a.m_size = (qsizetype)local_d8.d.d;
  local_d8.d.d = (Data *)qVar6;
  local_d8.d.ptr = (char16_t *)local_78.a.a.a.a.m_data;
  local_78.a.a.a.a.m_data = (char *)pcVar3;
  local_78.a.a.a.b = (QString *)local_d8.d.size;
  local_d8.d.size = (qsizetype)pQVar7;
  if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
    }
  }
LAB_00111da9:
  local_78.a.a.a.a.m_size = 7;
  local_78.a.a.a.a.m_data = "PRAGMA ";
  local_78.a.a.a.b = &local_b8;
  local_78.a.a.b.m_size = 0xc;
  local_78.a.a.b.m_data = "table_info (";
  local_78.b = L')';
  local_78.a.b = &local_d8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QString_&>,_char16_t>
  ::convertTo<QString>((QString *)&local_98,&local_78);
  QSqlQuery::exec(tableName);
  if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_98.shared = *(int *)local_98.shared + -1;
    UNLOCK();
    if (*(int *)local_98.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_98.shared,2,0x10);
    }
  }
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x40 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x48 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x30 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x38 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x20 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x28 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this->super_QSqlDriverPrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.a.a.a.b = (QString *)0x0;
  local_78.a.a.a.a.m_size = 0;
  local_78.a.a.a.a.m_data = (char *)0x0;
  local_98._16_8_ = 0;
  local_98.shared = (PrivateShared *)0x0;
  local_98._8_8_ = 0;
  QSqlIndex::QSqlIndex((QSqlIndex *)this,(QString *)&local_78,(QString *)&local_98);
  if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_98.shared = *(int *)local_98.shared + -1;
    UNLOCK();
    if (*(int *)local_98.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_98.shared,2,0x10);
    }
  }
  if ((QArrayData *)local_78.a.a.a.a.m_size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78.a.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78.a.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78.a.a.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_78.a.a.a.a.m_size,2,0x10);
    }
  }
  cVar8 = QSqlQuery::next();
  if (cVar8 != '\0') {
    do {
      RVar12 = (RequiredStatus)&local_78;
      QSqlQuery::value(RVar12);
      iVar9 = QVariant::toInt((bool *)&local_78);
      QVariant::~QVariant((QVariant *)&local_78);
      if ((in_R8B & iVar9 == 0) == 0) {
        local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QSqlQuery::value(RVar12);
        QVariant::toString();
        QString::toLower_helper(&local_f8);
        if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_98.shared = *(int *)local_98.shared + -1;
          UNLOCK();
          if (*(int *)local_98.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_98.shared,2,0x10);
          }
        }
        QVariant::~QVariant((QVariant *)&local_78);
        local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QSqlQuery::value(RVar12);
        QVariant::toString();
        QVariant::~QVariant((QVariant *)&local_78);
        if ((((QString *)local_118.d.size != (QString *)0x0) && (*local_118.d.ptr == L'\'')) &&
           (QVar17.m_data = local_118.d.ptr, QVar17.m_size = local_118.d.size,
           iVar10 = QtPrivate::lastIndexOf(QVar17,-1,L'\'',CaseSensitive), 0 < iVar10)) {
          QString::mid((longlong)&local_78,(longlong)&local_118);
          pQVar7 = local_78.a.a.a.b;
          qVar6 = local_78.a.a.a.a.m_size;
          pcVar3 = local_118.d.ptr;
          pDVar2 = local_118.d.d;
          local_78.a.a.a.a.m_size = (qsizetype)local_118.d.d;
          local_118.d.d = (Data *)qVar6;
          local_118.d.ptr = (char16_t *)local_78.a.a.a.a.m_data;
          local_78.a.a.a.a.m_data = (char *)pcVar3;
          local_78.a.a.a.b = (QString *)local_118.d.size;
          local_118.d.size = (qsizetype)pQVar7;
          if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
            }
          }
        }
        local_78.a.a.b.m_data = &DAT_aaaaaaaaaaaaaaaa;
        local_78.a.a.a.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.a.a.b.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.a.a.a.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.a.a.a.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
        iVar13 = (int)&local_98;
        QSqlQuery::value(iVar13);
        QVariant::toString();
        iVar10 = qGetColumnType(&local_f8);
        QMetaType::QMetaType(&local_138,iVar10);
        QSqlField::QSqlField
                  ((QSqlField *)&local_78,&local_130,local_138,
                   (QString *)CONCAT71(in_register_00000009,onlyPIndex));
        if (&(local_130.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_130.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_130.d.d)->super_QArrayData,2,0x10);
          }
        }
        QVariant::~QVariant((QVariant *)&local_98);
        if (((iVar9 != 0) && ((QString *)local_f8.d.size == (QString *)0x7)) &&
           (QVar18.m_data = local_f8.d.ptr, QVar18.m_size = 7, QVar19.m_data = "integer",
           QVar19.m_size = 7, cVar8 = QtPrivate::equalStrings(QVar18,QVar19), cVar8 != '\0')) {
          QSqlField::setAutoValue(SUB81(&local_78,0));
        }
        QSqlQuery::value(iVar13);
        QVariant::toInt((bool *)local_98.data);
        QSqlField::setRequiredStatus(RVar12);
        QVariant::~QVariant((QVariant *)&local_98);
        QVariant::QVariant((QVariant *)&local_98,&local_118);
        QSqlField::setDefaultValue((QVariant *)&local_78);
        QVariant::~QVariant((QVariant *)&local_98);
        QSqlIndex::append((QSqlField *)this);
        QSqlField::~QSqlField((QSqlField *)&local_78);
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      cVar8 = QSqlQuery::next();
    } while (cVar8 != '\0');
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QSqlIndex QSQLiteDriverPrivate::getTableInfo(QSqlQuery &query, const QString &tableName,
                                             bool onlyPIndex) const
{
    Q_Q(const QSQLiteDriver);
    QString schema;
    QString table = q->escapeIdentifier(tableName, QSqlDriver::TableName);
    const auto indexOfSeparator = table.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{table}.first(indexOfSeparator);
        auto rightName = QStringView{table}.sliced(indexOfSeparator + 1);
        if (isIdentifierEscaped(leftName) && isIdentifierEscaped(rightName)) {
            schema = leftName.toString() + u'.';
            table = rightName.toString();
        }
    }

    query.exec("PRAGMA "_L1 + schema + "table_info ("_L1 + table + u')');
    QSqlIndex ind;
    while (query.next()) {
        bool isPk = query.value(5).toInt();
        if (onlyPIndex && !isPk)
            continue;
        QString typeName = query.value(2).toString().toLower();
        QString defVal = query.value(4).toString();
        if (!defVal.isEmpty() && defVal.at(0) == u'\'') {
            const int end = defVal.lastIndexOf(u'\'');
            if (end > 0)
                defVal = defVal.mid(1, end - 1);
        }

        QSqlField fld(query.value(1).toString(), QMetaType(qGetColumnType(typeName)), tableName);
        if (isPk && (typeName == "integer"_L1))
            // INTEGER PRIMARY KEY fields are auto-generated in sqlite
            // INT PRIMARY KEY is not the same as INTEGER PRIMARY KEY!
            fld.setAutoValue(true);
        fld.setRequired(query.value(3).toInt() != 0);
        fld.setDefaultValue(defVal);
        ind.append(fld);
    }
    return ind;
}